

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void updateNormalHints(_GLFWwindow *window,int width,int height)

{
  int iVar1;
  XSizeHints *pXVar2;
  XSizeHints *hints;
  int height_local;
  int width_local;
  _GLFWwindow *window_local;
  
  pXVar2 = (*_glfw.x11.xlib.AllocSizeHints)();
  if (window->monitor == (_GLFWmonitor *)0x0) {
    if (window->resizable == 0) {
      pXVar2->flags = pXVar2->flags | 0x30;
      pXVar2->max_width = width;
      pXVar2->min_width = width;
      pXVar2->max_height = height;
      pXVar2->min_height = height;
    }
    else {
      if ((window->minwidth != -1) && (window->minheight != -1)) {
        pXVar2->flags = pXVar2->flags | 0x10;
        pXVar2->min_width = window->minwidth;
        pXVar2->min_height = window->minheight;
      }
      if ((window->maxwidth != -1) && (window->maxheight != -1)) {
        pXVar2->flags = pXVar2->flags | 0x20;
        pXVar2->max_width = window->maxwidth;
        pXVar2->max_height = window->maxheight;
      }
      if ((window->numer != -1) && (window->denom != -1)) {
        pXVar2->flags = pXVar2->flags | 0x80;
        iVar1 = window->numer;
        (pXVar2->max_aspect).x = iVar1;
        (pXVar2->min_aspect).x = iVar1;
        iVar1 = window->denom;
        (pXVar2->max_aspect).y = iVar1;
        (pXVar2->min_aspect).y = iVar1;
      }
    }
  }
  pXVar2->flags = pXVar2->flags | 0x200;
  pXVar2->win_gravity = 10;
  (*_glfw.x11.xlib.SetWMNormalHints)(_glfw.x11.display,(window->x11).handle,pXVar2);
  (*_glfw.x11.xlib.Free)(pXVar2);
  return;
}

Assistant:

static void updateNormalHints(_GLFWwindow* window, int width, int height)
{
    XSizeHints* hints = XAllocSizeHints();

    if (!window->monitor)
    {
        if (window->resizable)
        {
            if (window->minwidth != GLFW_DONT_CARE &&
                window->minheight != GLFW_DONT_CARE)
            {
                hints->flags |= PMinSize;
                hints->min_width = window->minwidth;
                hints->min_height = window->minheight;
            }

            if (window->maxwidth != GLFW_DONT_CARE &&
                window->maxheight != GLFW_DONT_CARE)
            {
                hints->flags |= PMaxSize;
                hints->max_width = window->maxwidth;
                hints->max_height = window->maxheight;
            }

            if (window->numer != GLFW_DONT_CARE &&
                window->denom != GLFW_DONT_CARE)
            {
                hints->flags |= PAspect;
                hints->min_aspect.x = hints->max_aspect.x = window->numer;
                hints->min_aspect.y = hints->max_aspect.y = window->denom;
            }
        }
        else
        {
            hints->flags |= (PMinSize | PMaxSize);
            hints->min_width  = hints->max_width  = width;
            hints->min_height = hints->max_height = height;
        }
    }

    hints->flags |= PWinGravity;
    hints->win_gravity = StaticGravity;

    XSetWMNormalHints(_glfw.x11.display, window->x11.handle, hints);
    XFree(hints);
}